

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O2

void WAsmJs::JitFunctionIfReady(ScriptFunction *func,uint interpretedCount)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  FunctionBody *body;
  undefined4 extraout_var;
  ScriptContext *pSVar3;
  
  body = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  bVar1 = ShouldJitFunction(body,interpretedCount);
  if (bVar1) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01453738,AsmjsEntryPointInfoPhase,sourceContextId,functionId);
    if (bVar1) {
      iVar2 = (*(body->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(body);
      Output::Print(L"Scheduling %s For Full JIT at callcount:%d\n",CONCAT44(extraout_var,iVar2),
                    (ulong)interpretedCount);
    }
    pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
    GenerateFunction(pSVar3->nativeCodeGen,body,func);
    body->field_0x17b = body->field_0x17b | 0x80;
  }
  return;
}

Assistant:

void JitFunctionIfReady(Js::ScriptFunction* func, uint interpretedCount /*= 0*/)
    {
#if ENABLE_NATIVE_CODEGEN
        Js::FunctionBody* body = func->GetFunctionBody();
        if (WAsmJs::ShouldJitFunction(body, interpretedCount))
        {
            if (PHASE_TRACE(Js::AsmjsEntryPointInfoPhase, body))
            {
                Output::Print(_u("Scheduling %s For Full JIT at callcount:%d\n"), body->GetDisplayName(), interpretedCount);
            }
            GenerateFunction(body->GetScriptContext()->GetNativeCodeGenerator(), body, func);
            body->SetIsAsmJsFullJitScheduled(true);
        }
#endif
    }